

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool google::protobuf::compiler::ruby::UsesTypeFromFile
               (Descriptor *message,FileDescriptor *file,string *error)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  Type TVar4;
  Descriptor *this;
  FileDescriptor *pFVar5;
  EnumDescriptor *this_00;
  string *__lhs;
  string *__rhs;
  string *in_RDX;
  FileDescriptor *in_RSI;
  Descriptor *in_RDI;
  int i_1;
  FieldDescriptor *field;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  FieldDescriptor *in_stack_fffffffffffffef0;
  int local_100;
  string local_f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  FieldDescriptor *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  int index;
  
  iVar6 = 0;
  do {
    index = iVar6;
    iVar2 = Descriptor::field_count(in_RDI);
    if (iVar2 <= iVar6) {
      local_100 = 0;
      while( true ) {
        iVar6 = Descriptor::nested_type_count(in_RDI);
        if (iVar6 <= local_100) {
          return false;
        }
        Descriptor::nested_type(in_RDI,local_100);
        bVar1 = UsesTypeFromFile((Descriptor *)in_RSI,(FileDescriptor *)in_RDX,
                                 (string *)CONCAT44(index,in_stack_ffffffffffffffd8));
        if (bVar1) break;
        local_100 = local_100 + 1;
      }
      return true;
    }
    local_30 = Descriptor::field(in_RDI,index);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4cbaf9);
    if (CVar3 == CPPTYPE_MESSAGE) {
      this = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffee0);
      pFVar5 = Descriptor::file(this);
      if (pFVar5 == in_RSI) goto LAB_004cbb56;
    }
    TVar4 = FieldDescriptor::type(in_stack_fffffffffffffef0);
    if (TVar4 == TYPE_ENUM) {
      this_00 = FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffffee0);
      pFVar5 = EnumDescriptor::file(this_00);
      if (pFVar5 == in_RSI) {
LAB_004cbb56:
        FieldDescriptor::full_name_abi_cxx11_(local_30);
        std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        std::operator+(in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
        __lhs = FileDescriptor::name_abi_cxx11_(in_RSI);
        std::operator+(__lhs,in_stack_fffffffffffffee0);
        std::operator+(__lhs,(char *)in_stack_fffffffffffffee0);
        __rhs = FileDescriptor::name_abi_cxx11_(in_RSI);
        std::operator+(__lhs,__rhs);
        std::operator+(__lhs,(char *)__rhs);
        std::__cxx11::string::operator=(in_RDX,local_50);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_f0);
        return true;
      }
    }
    iVar6 = index + 1;
  } while( true );
}

Assistant:

bool UsesTypeFromFile(const Descriptor* message, const FileDescriptor* file,
                      string* error) {
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if ((field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
         field->message_type()->file() == file) ||
        (field->type() == FieldDescriptor::TYPE_ENUM &&
         field->enum_type()->file() == file)) {
      *error = "proto3 message field " + field->full_name() + " in file " +
               file->name() + " has a dependency on a type from proto2 file " +
               file->name() +
               ".  Ruby doesn't support proto2 yet, so we must fail.";
      return true;
    }
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (UsesTypeFromFile(message->nested_type(i), file, error)) {
      return true;
    }
  }

  return false;
}